

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CGL::GLScene::Mesh::split_selected_edge(Mesh *this)

{
  HalfedgeElement *this_00;
  Edge *pEVar1;
  
  this_00 = (this->selectedFeature).element;
  if (this_00 != (HalfedgeElement *)0x0) {
    pEVar1 = HalfedgeElement::getEdge(this_00);
    if (pEVar1 != (Edge *)0x0) {
      HalfedgeMesh::splitEdge(&this->mesh,(pEVar1->_halfedge)._M_node[3]._M_next);
      (*(this->super_SceneObject)._vptr_SceneObject[8])(this);
      return;
    }
  }
  return;
}

Assistant:

void Mesh::split_selected_edge() {
  HalfedgeElement *element = selectedFeature.element;
  if (element == nullptr) return;
  Edge *edge = element->getEdge();
  if (edge == nullptr) return;
  mesh.splitEdge(edge->halfedge()->edge());
  invalidate_selection();
}